

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,10,false>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_10,_false>_> *other)

{
  long lVar1;
  long lVar2;
  Index col;
  long lVar3;
  undefined8 *puVar4;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  DenseStorage<double,_-1,_-1,_-1,_0>::resize((DenseStorage<double,__1,__1,__1,_0> *)this,10,1,10);
  if (*(long *)(other + 0x28) != 1) {
    __assert_fail("v == T(Value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/util/XprHelper.h"
                  ,0x6e,
                  "Eigen::internal::variable_if_dynamic<long, 1>::variable_if_dynamic(T) [T = long, Value = 1]"
                 );
  }
  puVar4 = *(undefined8 **)other;
  lVar1 = *(long *)(*(long *)(other + 0x10) + 8);
  if ((*(long *)(this + 8) != 1) || (*(long *)(this + 0x10) != 10)) {
    DenseStorage<double,_-1,_-1,_-1,_0>::resize((DenseStorage<double,__1,__1,__1,_0> *)this,10,1,10)
    ;
    if ((*(long *)(this + 8) != 1) || (*(long *)(this + 0x10) != 10)) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2d1,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1, 10>, T1 = double, T2 = double]"
                   );
    }
  }
  lVar2 = *(long *)this;
  lVar3 = 0;
  do {
    *(undefined8 *)(lVar2 + lVar3 * 8) = *puVar4;
    lVar3 = lVar3 + 1;
    puVar4 = puVar4 + lVar1;
  } while (lVar3 != 10);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }